

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.h
# Opt level: O0

void __thiscall
FIX::FileStoreFactory::FileStoreFactory(FileStoreFactory *this,SessionSettings *settings)

{
  SessionSettings *settings_local;
  FileStoreFactory *this_local;
  
  MessageStoreFactory::MessageStoreFactory((MessageStoreFactory *)this);
  *(code **)this = __cxa_finalize;
  std::__cxx11::string::string((string *)(this + 8));
  SessionSettings::SessionSettings((SessionSettings *)(this + 0x28),settings);
  return;
}

Assistant:

FileStoreFactory(const SessionSettings &settings)
      : m_settings(settings) {}